

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

uint8_t rev_byte(uint8_t sprite_byte)

{
  byte bVar1;
  uint8_t bit_num;
  int iVar2;
  long lVar3;
  int bits_left;
  uint uVar4;
  undefined3 in_register_00000039;
  char acStack_8 [5];
  char acStack_3 [3];
  
  uVar4 = 1;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    acStack_8[lVar3] = (uVar4 & CONCAT31(in_register_00000039,sprite_byte)) != 0;
    uVar4 = (uVar4 & 0xff) * 2;
  }
  uVar4 = 7;
  bVar1 = 0;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    bVar1 = bVar1 | acStack_8[uVar4] << ((byte)iVar2 & 0x1f);
    uVar4 = uVar4 - 1;
  }
  return bVar1;
}

Assistant:

static uint8_t rev_byte(uint8_t sprite_byte) {
    uint8_t bit_count = 8;
    bool bits[bit_count];
    uint8_t reversed = 0;

    uint8_t mask = 0x1;
    for(uint8_t bit_num = 0; bit_num < bit_count; bit_num++) {
        bits[bit_num] = sprite_byte & mask;
        mask <<= 1;
    }

    uint8_t shift_amount = 0;
    for(int bits_left = 7; bits_left >= 0; bits_left--) {
        reversed |= bits[bits_left] << shift_amount;
        shift_amount++;
    }
    return reversed;
}